

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

string * __thiscall
stun::attribute::decoding_bits::errcode::reason_phrase_abi_cxx11_
          (string *__return_storage_ptr__,errcode *this)

{
  size_t sVar1;
  size_t sVar2;
  allocator local_29;
  size_t local_28;
  size_t str_len;
  char *str;
  errcode *this_local;
  
  str = (char *)this;
  this_local = (errcode *)__return_storage_ptr__;
  str_len = (size_t)stun_attr_errcode_reason((this->super_attribute_base<_stun_attr_errcode>).attr_)
  ;
  sVar2 = stun_attr_errcode_reason_len((this->super_attribute_base<_stun_attr_errcode>).attr_);
  sVar1 = str_len;
  local_28 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)sVar1,sVar2,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string reason_phrase() const {
    const char *str = stun_attr_errcode_reason(attr_);
    size_t str_len = stun_attr_errcode_reason_len(attr_);
    return std::string(str, str_len);
  }